

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O0

int ON_wString::CompareAttributeName(wchar_t *name1,wchar_t *name2)

{
  int iVar1;
  bool bVar2;
  uint local_2c;
  uint local_28;
  uint rank2;
  uint rank1;
  bool bIgnoreCase;
  wchar_t *name2_local;
  wchar_t *name1_local;
  
  if (name1 == name2) {
    return 0;
  }
  _rank1 = name2;
  name2_local = name1;
  if ((name1 != (wchar_t *)0x0) && (name2 != (wchar_t *)0x0)) {
    local_28 = Internal_NameAttributeWideCharRank(*name1,true);
    local_2c = Internal_NameAttributeWideCharRank(*name2,true);
    while( true ) {
      bVar2 = false;
      if ((local_28 == local_2c) && (bVar2 = false, local_28 != 0xffffffff)) {
        bVar2 = local_28 != 0;
      }
      if (!bVar2) break;
      name2_local = name2_local + 1;
      _rank1 = _rank1 + 1;
      local_28 = Internal_NameAttributeWideCharRank(*name2_local,true);
      local_2c = Internal_NameAttributeWideCharRank(*_rank1,true);
    }
    if ((local_28 != 0xffffffff) || (local_2c != 0xffffffff)) {
      if (local_28 < local_2c) {
        return -1;
      }
      if (local_2c < local_28) {
        return 1;
      }
      if (local_28 == 0) {
        return 0;
      }
    }
  }
  iVar1 = CompareOrdinal(name2_local,-1,_rank1,-1,true);
  return iVar1;
}

Assistant:

int ON_wString::CompareAttributeName(
  const wchar_t* name1,
  const wchar_t* name2
  )
{
  if (name1 == name2)
    return 0;

  const bool bIgnoreCase = true;

  if ( nullptr != name1 && nullptr != name2 )
  {
    // Sort leading underbar before 'A'
    // https://mcneel.myjetbrains.com/youtrack/issue/RH-41224

    unsigned int rank1 = Internal_NameAttributeWideCharRank(*name1,bIgnoreCase);
    unsigned int rank2 = Internal_NameAttributeWideCharRank(*name2,bIgnoreCase);
    while (rank1 == rank2 && ON_UNSET_UINT_INDEX != rank1 && 0 != rank1)
    {
      name1++;
      name2++;
      rank1 = Internal_NameAttributeWideCharRank(*name1,bIgnoreCase);
      rank2 = Internal_NameAttributeWideCharRank(*name2,bIgnoreCase);
    }

    if (ON_UNSET_UINT_INDEX != rank1 || ON_UNSET_UINT_INDEX != rank2)
    {
      if (rank1 < rank2)
        return -1;
      if (rank1 > rank2)
        return 1;
      if (0 == rank1)
        return 0;
    }
  }

  // name1 or name2 is nullptr or begins with an unranked code point.
  return ON_wString::CompareOrdinal(name1, -1, name2, -1, bIgnoreCase);
}